

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_xor_many(size_t number,roaring_bitmap_t **x)

{
  roaring_bitmap_t *prVar1;
  size_t sVar2;
  
  if (number == 1) {
    prVar1 = roaring_bitmap_copy(*x);
    return prVar1;
  }
  if (number == 0) {
    prVar1 = roaring_bitmap_create_with_capacity(0);
    return prVar1;
  }
  prVar1 = roaring_bitmap_lazy_xor(*x,x[1]);
  if (2 < number) {
    sVar2 = 2;
    do {
      roaring_bitmap_lazy_xor_inplace(prVar1,x[sVar2]);
      sVar2 = sVar2 + 1;
    } while (number != sVar2);
  }
  roaring_bitmap_repair_after_lazy(prVar1);
  return prVar1;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_xor_many(size_t number,
                                          const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_bitmap_t *answer = roaring_bitmap_lazy_xor(x[0], x[1]);
    for (size_t i = 2; i < number; i++) {
        roaring_bitmap_lazy_xor_inplace(answer, x[i]);
    }
    roaring_bitmap_repair_after_lazy(answer);
    return answer;
}